

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O0

int ps_remove_search(ps_decoder_t *ps,char *name)

{
  ps_search_t *ppVar1;
  ps_search_t *search;
  char *name_local;
  ps_decoder_t *ps_local;
  
  ppVar1 = (ps_search_t *)hash_table_delete(ps->searches,name);
  if (ppVar1 == (ps_search_t *)0x0) {
    ps_local._4_4_ = -1;
  }
  else {
    if (ps->search == ppVar1) {
      ps->search = (ps_search_t *)0x0;
    }
    (*ppVar1->vt->free)(ppVar1);
    ps_local._4_4_ = 0;
  }
  return ps_local._4_4_;
}

Assistant:

int 
ps_remove_search(ps_decoder_t *ps, const char *name)
{
    ps_search_t *search = hash_table_delete(ps->searches, name);
    if (!search)
        return -1;
    if (ps->search == search)
        ps->search = NULL;
    ps_search_free(search);
    return 0;
}